

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::UsdUVTexture>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,UsdUVTexture *tex,string *prop_name,Property *out_prop)

{
  bool bVar1;
  pointer ppVar2;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
  *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool local_ca;
  bool local_c9;
  _Self local_c8;
  _Self local_c0;
  const_iterator it;
  string local_b0 [32];
  string local_90;
  undefined1 local_70 [32];
  undefined1 local_50 [8];
  string err;
  Property *out_prop_local;
  string *prop_name_local;
  UsdUVTexture *tex_local;
  
  if (out_prop == (Property *)0x0) {
    err.field_2._8_8_ =
         nonstd::expected_lite::make_unexpected<char_const(&)[59]>
                   ((char (*) [59])"[InternalError] nullptr in output Property is not allowed.");
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>
              (__return_storage_ptr__,(unexpected_type<const_char_*> *)((long)&err.field_2 + 8));
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string((string *)local_50);
  bVar1 = ::std::operator==(prop_name,"inputs:file");
  if (bVar1) {
    bVar1 = ToProperty<tinyusdz::value::AssetPath>(&tex->file,out_prop,(string *)local_50);
    if (!bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_b0,"Convert Property {} failed: {}\n",(allocator *)((long)&it._M_node + 7));
      fmt::format<char[12],std::__cxx11::string>
                (&local_90,(fmt *)local_b0,(string *)"inputs:file",(char (*) [12])local_50,in_R8);
      nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_70,(expected_lite *)&local_90,value);
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,
                 (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_70);
      nonstd::expected_lite::
      unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_70);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::__cxx11::string::~string(local_b0);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
      goto LAB_004b34f0;
    }
  }
  else {
    local_c0._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                 *)&(tex->super_ShaderNode).super_UsdShadePrim.props,prop_name);
    local_c8._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                *)&(tex->super_ShaderNode).super_UsdShadePrim.props);
    bVar1 = ::std::operator==(&local_c0,&local_c8);
    if (bVar1) {
      local_c9 = false;
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<bool,_0>(__return_storage_ptr__,&local_c9);
      goto LAB_004b34f0;
    }
    ppVar2 = ::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
             ::operator->(&local_c0);
    Property::operator=(out_prop,&ppVar2->second);
  }
  local_ca = true;
  nonstd::expected_lite::
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  expected<bool,_0>(__return_storage_ptr__,&local_ca);
LAB_004b34f0:
  it._M_node._0_4_ = 1;
  ::std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const UsdUVTexture &tex, const std::string &prop_name, Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  DCOUT("prop_name = " << prop_name);
  std::string err;

  TO_PROPERTY("inputs:file", tex.file)

  {
    const auto it = tex.props.find(prop_name);
    if (it == tex.props.end()) {
      // Attribute not found.
      return false;
    }

    (*out_prop) = it->second;
  }

  return true;
}